

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,char *significand,
          int significand_size,int integral_size,char16_t decimal_point)

{
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out_00;
  undefined2 in_register_00000082;
  char16_t local_2a;
  
  local_2a = decimal_point;
  out_00 = copy_str_noinline<char16_t,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                     (significand,significand + integral_size,out);
  if (CONCAT22(in_register_00000082,decimal_point) != 0) {
    buffer<char16_t>::push_back(out_00.container,&local_2a);
    out_00 = copy_str_noinline<char16_t,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                       (significand + integral_size,significand + significand_size,out_00);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out_00.container;
}

Assistant:

FMT_CONSTEXPR auto write_significand(OutputIt out, const char* significand,
                                     int significand_size, int integral_size,
                                     Char decimal_point) -> OutputIt {
  out = detail::copy_str_noinline<Char>(significand,
                                        significand + integral_size, out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_str_noinline<Char>(significand + integral_size,
                                         significand + significand_size, out);
}